

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O0

void __thiscall Assimp::Q3BSP::Q3BSPModel::~Q3BSPModel(Q3BSPModel *this)

{
  size_type sVar1;
  reference ppsVar2;
  reference ppsVar3;
  reference ppsVar4;
  reference ppsVar5;
  reference ppsVar6;
  uint local_24;
  uint local_20;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  Q3BSPModel *this_local;
  
  i_2 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            size(&this->m_Lumps);
    if (sVar1 <= i_2) break;
    ppsVar2 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_Lumps,(ulong)i_2);
    if (*ppsVar2 != (value_type)0x0) {
      operator_delete(*ppsVar2);
    }
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    sVar1 = std::
            vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::
            size(&this->m_Vertices);
    if (sVar1 <= i_3) break;
    ppsVar3 = std::
              vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
              ::operator[](&this->m_Vertices,(ulong)i_3);
    if (*ppsVar3 != (value_type)0x0) {
      operator_delete(*ppsVar3);
    }
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
            size(&this->m_Faces);
    if (sVar1 <= i_4) break;
    ppsVar4 = std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
              ::operator[](&this->m_Faces,(ulong)i_4);
    if (*ppsVar4 != (value_type)0x0) {
      operator_delete(*ppsVar4);
    }
    i_4 = i_4 + 1;
  }
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
            ::size(&this->m_Textures);
    if (sVar1 <= local_20) break;
    ppsVar5 = std::
              vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
              ::operator[](&this->m_Textures,(ulong)local_20);
    if (*ppsVar5 != (value_type)0x0) {
      operator_delete(*ppsVar5);
    }
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while( true ) {
    sVar1 = std::
            vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
            ::size(&this->m_Lightmaps);
    if (sVar1 <= local_24) break;
    ppsVar6 = std::
              vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
              ::operator[](&this->m_Lightmaps,(ulong)local_24);
    if (*ppsVar6 != (value_type)0x0) {
      operator_delete(*ppsVar6);
    }
    local_24 = local_24 + 1;
  }
  std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::clear
            (&this->m_Lumps);
  std::vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::clear
            (&this->m_Vertices);
  std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::clear
            (&this->m_Faces);
  std::vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>::
  clear(&this->m_Textures);
  std::vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>::
  clear(&this->m_Lightmaps);
  std::__cxx11::string::~string((string *)&this->m_ModelName);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_EntityData);
  std::vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>::
  ~vector(&this->m_Lightmaps);
  std::vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>::
  ~vector(&this->m_Textures);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_Indices);
  std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::~vector
            (&this->m_Faces);
  std::vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::
  ~vector(&this->m_Vertices);
  std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::~vector
            (&this->m_Lumps);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_Data);
  return;
}

Assistant:

~Q3BSPModel() {
        for ( unsigned int i=0; i<m_Lumps.size(); i++ ) {
            delete m_Lumps[ i ];
        }
        for ( unsigned int i=0; i<m_Vertices.size(); i++ ) {
            delete m_Vertices[ i ];
        }
        for ( unsigned int i=0; i<m_Faces.size(); i++ ) {
            delete m_Faces[ i ];
        }
        for ( unsigned int i=0; i<m_Textures.size(); i++ ) {
            delete m_Textures[ i ];
        }
        for ( unsigned int i=0; i<m_Lightmaps.size(); i++ ) {
            delete m_Lightmaps[ i ];
        }

        m_Lumps.clear();
        m_Vertices.clear();
        m_Faces.clear();
        m_Textures.clear();
        m_Lightmaps.clear();
    }